

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void hedg::rest::get_session_id_msg(request<http::string_body> *req,login *login_params)

{
  login *plVar1;
  value_type *this;
  string local_a8;
  string_view local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  login *local_18;
  login *login_params_local;
  request<http::string_body> *req_local;
  
  local_18 = login_params;
  login_params_local = (login *)req;
  boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::login_host_abi_cxx11_);
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)req,host,&local_28);
  plVar1 = login_params_local;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"X-Application");
  boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::app_key_abi_cxx11_);
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)plVar1,local_38,&local_48);
  plVar1 = login_params_local;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,"X-Authentication");
  boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::user_agent_abi_cxx11_);
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)plVar1,local_58,&local_68);
  plVar1 = login_params_local;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_78,"application/x-www-form-urlencoded");
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)plVar1,content_type,&local_78);
  plVar1 = login_params_local;
  boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::user_agent_abi_cxx11_);
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)plVar1,user_agent,&local_88);
  params::login::body_abi_cxx11_(&local_a8,login_params);
  this = boost::beast::http::
         message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
         ::body_abi_cxx11_((message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
                            *)login_params_local);
  std::__cxx11::string::operator=((string *)this,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::prepare_payload((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                     *)login_params_local);
  return;
}

Assistant:

void get_session_id_msg(http::request<http::string_body>& req, params::login login_params) {

		req.set(http::field::host, config::login_host);
		req.set("X-Application", config::app_key);
		req.set("X-Authentication", config::user_agent);
		req.set(http::field::content_type, "application/x-www-form-urlencoded");
		req.set(http::field::user_agent, config::user_agent);
		req.body() = login_params.body();
		req.prepare_payload();
	}